

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O1

void __thiscall sznet::Logger::Impl::finish(Impl *this)

{
  char **ppcVar1;
  char *pcVar2;
  LogStream *pLVar3;
  char **ppcVar4;
  ulong __n;
  int iVar5;
  
  ppcVar4 = &(this->m_stream).m_buffer.m_cur;
  pcVar2 = (this->m_stream).m_buffer.m_cur;
  iVar5 = (int)ppcVar4;
  if ((iVar5 - (int)pcVar2 & 0xfffffffcU) != 0) {
    pcVar2[2] = ' ';
    pcVar2[0] = ' ';
    pcVar2[1] = '-';
    *ppcVar4 = *ppcVar4 + 3;
  }
  __n = (ulong)(this->m_basename).m_size;
  pcVar2 = (this->m_stream).m_buffer.m_cur;
  if (__n < (ulong)(long)(iVar5 - (int)pcVar2)) {
    memcpy(pcVar2,(this->m_basename).m_data,__n);
    ppcVar1 = &(this->m_stream).m_buffer.m_cur;
    *ppcVar1 = *ppcVar1 + __n;
  }
  if ((iVar5 - (int)*ppcVar4 & 0xfffffffeU) != 0) {
    **ppcVar4 = ':';
    *ppcVar4 = *ppcVar4 + 1;
  }
  pLVar3 = LogStream::operator<<(&this->m_stream,this->m_line);
  pcVar2 = (pLVar3->m_buffer).m_cur;
  ppcVar4 = &(pLVar3->m_buffer).m_cur;
  if (((int)ppcVar4 - (int)pcVar2 & 0xfffffffeU) != 0) {
    *pcVar2 = '\n';
    *ppcVar4 = *ppcVar4 + 1;
  }
  return;
}

Assistant:

void Logger::Impl::finish()
{
	m_stream << " - " << m_basename << ':' << m_line << '\n';
}